

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__point *
stbtt_FlattenCurves(stbtt_vertex *vertices,int num_verts,float objspace_flatness,
                   int **contour_lengths,int *num_contours,void *userdata)

{
  uint n_00;
  float fVar1;
  void *pvVar2;
  int *in_RCX;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  int unaff_retaddr;
  float in_stack_00000008;
  float in_stack_0000000c;
  float y;
  float x;
  int pass;
  int start;
  int n;
  int i;
  float objspace_flatness_squared;
  int num_points;
  stbtt__point *points;
  void *in_stack_ffffffffffffffa0;
  float y2;
  float x2;
  float y1;
  float x1;
  float n_01;
  int iVar4;
  float y0;
  int iVar5;
  float x0;
  stbtt__point *local_8;
  
  local_8 = (stbtt__point *)0x0;
  fVar3 = in_XMM0_Da * in_XMM0_Da;
  iVar4 = 0;
  x1 = 0.0;
  for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
    if (*(char *)(in_RDI + (long)iVar5 * 0xe + 0xc) == '\x01') {
      iVar4 = iVar4 + 1;
    }
  }
  *in_RCX = iVar4;
  if (iVar4 == 0) {
    local_8 = (stbtt__point *)0x0;
  }
  else {
    pvVar2 = ImGui::MemAlloc((size_t)in_stack_ffffffffffffffa0);
    *in_RDX = (long)pvVar2;
    if (*in_RDX == 0) {
      *in_RCX = 0;
      local_8 = (stbtt__point *)0x0;
    }
    else {
      for (y1 = 0.0; (int)y1 < 2; y1 = (float)((int)y1 + 1)) {
        x2 = 0.0;
        y2 = 0.0;
        if ((y1 == 1.4013e-45) &&
           (local_8 = (stbtt__point *)ImGui::MemAlloc((size_t)in_stack_ffffffffffffffa0),
           local_8 == (stbtt__point *)0x0)) {
          ImGui::MemFree(in_stack_ffffffffffffffa0);
          ImGui::MemFree(in_stack_ffffffffffffffa0);
          *in_RDX = 0;
          *in_RCX = 0;
          return (stbtt__point *)0x0;
        }
        y0 = -NAN;
        n_01 = 0.0;
        for (x0 = 0.0; (int)x0 < in_ESI; x0 = (float)((int)x0 + 1)) {
          n_00 = *(byte *)(in_RDI + 0xc + (long)(int)x0 * 0xe) - 1;
          in_stack_ffffffffffffffa0 = (void *)(ulong)n_00;
          fVar1 = n_01;
          switch(in_stack_ffffffffffffffa0) {
          case (void *)0x0:
            if (-1 < (int)y0) {
              *(int *)(*in_RDX + (long)(int)y0 * 4) = (int)n_01 - (int)x1;
            }
            y0 = (float)((int)y0 + 1);
            x2 = (float)(int)*(short *)(in_RDI + (long)(int)x0 * 0xe);
            y2 = (float)(int)*(short *)(in_RDI + 2 + (long)(int)x0 * 0xe);
            fVar1 = (float)((int)n_01 + 1);
            stbtt__add_point(local_8,(int)n_01,x2,y2);
            x1 = n_01;
            break;
          case (void *)0x1:
            x2 = (float)(int)*(short *)(in_RDI + (long)(int)x0 * 0xe);
            y2 = (float)(int)*(short *)(in_RDI + 2 + (long)(int)x0 * 0xe);
            fVar1 = (float)((int)n_01 + 1);
            stbtt__add_point(local_8,(int)n_01,x2,y2);
            break;
          case (void *)0x2:
            stbtt__tesselate_curve(local_8,(int *)CONCAT44(n_01,fVar3),x0,y0,x1,y1,x2,y2,0.0,n_00);
            x2 = (float)(int)*(short *)(in_RDI + (long)(int)x0 * 0xe);
            y2 = (float)(int)*(short *)(in_RDI + 2 + (long)(int)x0 * 0xe);
            fVar1 = n_01;
            break;
          case (void *)0x3:
            stbtt__tesselate_cubic
                      (points,_objspace_flatness_squared,(float)i,(float)n,(float)start,(float)pass,
                       x,y,in_stack_0000000c,in_stack_00000008,num_contours._0_4_,unaff_retaddr);
            x2 = (float)(int)*(short *)(in_RDI + (long)(int)x0 * 0xe);
            y2 = (float)(int)*(short *)(in_RDI + 2 + (long)(int)x0 * 0xe);
            fVar1 = n_01;
          }
          n_01 = fVar1;
        }
        *(int *)(*in_RDX + (long)(int)y0 * 4) = (int)n_01 - (int)x1;
      }
    }
  }
  return local_8;
}

Assistant:

static stbtt__point *stbtt_FlattenCurves(stbtt_vertex *vertices, int num_verts, float objspace_flatness, int **contour_lengths, int *num_contours, void *userdata)
{
   stbtt__point *points=0;
   int num_points=0;

   float objspace_flatness_squared = objspace_flatness * objspace_flatness;
   int i,n=0,start=0, pass;

   // count how many "moves" there are to get the contour count
   for (i=0; i < num_verts; ++i)
      if (vertices[i].type == STBTT_vmove)
         ++n;

   *num_contours = n;
   if (n == 0) return 0;

   *contour_lengths = (int *) STBTT_malloc(sizeof(**contour_lengths) * n, userdata);

   if (*contour_lengths == 0) {
      *num_contours = 0;
      return 0;
   }

   // make two passes through the points so we don't need to realloc
   for (pass=0; pass < 2; ++pass) {
      float x=0,y=0;
      if (pass == 1) {
         points = (stbtt__point *) STBTT_malloc(num_points * sizeof(points[0]), userdata);
         if (points == NULL) goto error;
      }
      num_points = 0;
      n= -1;
      for (i=0; i < num_verts; ++i) {
         switch (vertices[i].type) {
            case STBTT_vmove:
               // start the next contour
               if (n >= 0)
                  (*contour_lengths)[n] = num_points - start;
               ++n;
               start = num_points;

               x = vertices[i].x, y = vertices[i].y;
               stbtt__add_point(points, num_points++, x,y);
               break;
            case STBTT_vline:
               x = vertices[i].x, y = vertices[i].y;
               stbtt__add_point(points, num_points++, x, y);
               break;
            case STBTT_vcurve:
               stbtt__tesselate_curve(points, &num_points, x,y,
                                        vertices[i].cx, vertices[i].cy,
                                        vertices[i].x,  vertices[i].y,
                                        objspace_flatness_squared, 0);
               x = vertices[i].x, y = vertices[i].y;
               break;
            case STBTT_vcubic:
               stbtt__tesselate_cubic(points, &num_points, x,y,
                                        vertices[i].cx, vertices[i].cy,
                                        vertices[i].cx1, vertices[i].cy1,
                                        vertices[i].x,  vertices[i].y,
                                        objspace_flatness_squared, 0);
               x = vertices[i].x, y = vertices[i].y;
               break;
         }
      }
      (*contour_lengths)[n] = num_points - start;
   }

   return points;
error:
   STBTT_free(points, userdata);
   STBTT_free(*contour_lengths, userdata);
   *contour_lengths = 0;
   *num_contours = 0;
   return NULL;
}